

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O1

CURLUcode ipv6_parse(Curl_URL *u,char *hostname,size_t hlen)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  char *pcVar6;
  size_t sVar7;
  ulong uVar8;
  char cVar9;
  char *__s;
  CURLUcode CVar10;
  char *pcVar11;
  bool bVar12;
  char zoneid [16];
  char local_48 [24];
  
  if (hlen < 4) {
    return CURLUE_BAD_IPV6;
  }
  __s = hostname + 1;
  sVar5 = strspn(__s,"0123456789abcdefABCDEF:.");
  sVar7 = hlen - 2;
  if (hlen - 2 != sVar5) {
    if (__s[sVar5] != '%') {
      return CURLUE_BAD_IPV6;
    }
    pcVar11 = __s + sVar5;
    pcVar6 = pcVar11 + 1;
    iVar3 = strncmp(pcVar6,"25",2);
    if (((iVar3 == 0) && (pcVar11[3] != '\0')) && (pcVar11[3] != ']')) {
      pcVar6 = pcVar11 + 3;
    }
    cVar9 = *pcVar6;
    uVar4 = 0;
    uVar8 = 0;
    if (cVar9 == '\0') {
      bVar12 = false;
    }
    else {
      do {
        if ((cVar9 == ']') || (0xe < uVar8)) goto LAB_0016985c;
        uVar1 = uVar8 + 1;
        local_48[uVar8] = cVar9;
        cVar9 = pcVar6[uVar8 + 1];
        uVar8 = uVar1;
      } while (cVar9 != '\0');
      uVar8 = uVar1 & 0xffffffff;
LAB_0016985c:
      uVar4 = (uint)uVar8;
      bVar12 = cVar9 == ']';
    }
    bVar2 = false;
    CVar10 = CURLUE_BAD_IPV6;
    if ((uVar4 != 0) && (bVar12)) {
      local_48[uVar4] = '\0';
      pcVar6 = (*Curl_cstrdup)(local_48);
      u->zoneid = pcVar6;
      if (pcVar6 == (char *)0x0) {
        CVar10 = CURLUE_OUT_OF_MEMORY;
        bVar2 = false;
      }
      else {
        pcVar11[0] = ']';
        pcVar11[1] = '\0';
        bVar2 = true;
      }
    }
    sVar7 = sVar5;
    if (!bVar2) {
      return CVar10;
    }
  }
  __s[sVar7] = '\0';
  iVar3 = inet_pton(10,__s,local_48);
  CVar10 = CURLUE_BAD_IPV6;
  if (iVar3 == 1) {
    pcVar6 = inet_ntop(10,local_48,__s,(socklen_t)sVar7);
    if (pcVar6 != (char *)0x0) {
      sVar7 = strlen(__s);
      hostname[sVar7 + 2] = '\0';
    }
    __s[sVar7] = ']';
    CVar10 = CURLUE_OK;
  }
  return CVar10;
}

Assistant:

static CURLUcode ipv6_parse(struct Curl_URL *u, char *hostname,
                            size_t hlen) /* length of hostname */
{
  size_t len;
  DEBUGASSERT(*hostname == '[');
  if(hlen < 4) /* '[::]' is the shortest possible valid string */
    return CURLUE_BAD_IPV6;
  hostname++;
  hlen -= 2;

  /* only valid IPv6 letters are ok */
  len = strspn(hostname, "0123456789abcdefABCDEF:.");

  if(hlen != len) {
    hlen = len;
    if(hostname[len] == '%') {
      /* this could now be '%[zone id]' */
      char zoneid[16];
      int i = 0;
      char *h = &hostname[len + 1];
      /* pass '25' if present and is a URL encoded percent sign */
      if(!strncmp(h, "25", 2) && h[2] && (h[2] != ']'))
        h += 2;
      while(*h && (*h != ']') && (i < 15))
        zoneid[i++] = *h++;
      if(!i || (']' != *h))
        return CURLUE_BAD_IPV6;
      zoneid[i] = 0;
      u->zoneid = strdup(zoneid);
      if(!u->zoneid)
        return CURLUE_OUT_OF_MEMORY;
      hostname[len] = ']'; /* insert end bracket */
      hostname[len + 1] = 0; /* terminate the hostname */
    }
    else
      return CURLUE_BAD_IPV6;
    /* hostname is fine */
  }

  /* Normalize the IPv6 address */
  {
    char dest[16]; /* fits a binary IPv6 address */
    hostname[hlen] = 0; /* end the address there */
    if(1 != curlx_inet_pton(AF_INET6, hostname, dest))
      return CURLUE_BAD_IPV6;
    if(curlx_inet_ntop(AF_INET6, dest, hostname, hlen)) {
      hlen = strlen(hostname); /* might be shorter now */
      hostname[hlen + 1] = 0;
    }
    hostname[hlen] = ']'; /* restore ending bracket */
  }
  return CURLUE_OK;
}